

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADEC-CORE.cpp
# Opt level: O1

void bb_max_clq(void)

{
  int iVar1;
  bool bVar2;
  size_t __result_2;
  _Elt_pointer pbVar3;
  size_t __result_1;
  long lVar4;
  size_t __i;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  _Elt_pointer pbVar8;
  Vset *pVVar9;
  ulong uVar10;
  size_t __result;
  _WordT *p_Var11;
  byte bVar12;
  _WordT a_Stack_1dc8 [235];
  ulong local_1670;
  void *local_1668;
  ulong local_1660;
  Vset *local_1658;
  void *local_1650;
  _Elt_pointer local_1648;
  ulong local_1640;
  bb_content local_1638;
  
  bVar12 = 0;
  bVar2 = KDefectiveMADEC::TimeIsUp(controller);
  if (!bVar2) {
    pbVar3 = bb_stack.c.super__Deque_base<bb_content,_std::allocator<bb_content>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    pbVar8 = bb_stack.c.super__Deque_base<bb_content,_std::allocator<bb_content>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (bb_stack.c.super__Deque_base<bb_content,_std::allocator<bb_content>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur ==
        bb_stack.c.super__Deque_base<bb_content,_std::allocator<bb_content>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      pbVar8 = bb_stack.c.super__Deque_base<bb_content,_std::allocator<bb_content>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 1;
      pbVar3 = bb_stack.c.super__Deque_base<bb_content,_std::allocator<bb_content>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 1;
    }
    TREE_SIZE = TREE_SIZE + 1;
    pbVar8 = pbVar8 + -1;
    local_1658 = &pbVar3[-1].C;
    lVar4 = -0x1d6;
    local_1670 = 0;
    do {
      uVar5 = (pbVar3->P).super__Base_bitset<235UL>._M_w[lVar4];
      uVar5 = uVar5 - (uVar5 >> 1 & 0x5555555555555555);
      uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
      local_1670 = local_1670 +
                   (((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
      lVar4 = lVar4 + 1;
    } while (lVar4 != -0xeb);
    uVar5 = 0xffffffffffffffff;
    if (-1 < (long)(local_1670 << 0x20)) {
      uVar5 = (long)(local_1670 << 0x20) >> 0x1e;
    }
    local_1668 = operator_new__(uVar5);
    uVar10 = local_1670;
    local_1650 = operator_new__(uVar5);
    pVVar9 = local_1658;
    p_Var11 = a_Stack_1dc8;
    for (lVar4 = 0xeb; lVar4 != 0; lVar4 = lVar4 + -1) {
      *p_Var11 = (pVVar9->super__Base_bitset<235UL>)._M_w[0];
      pVVar9 = (Vset *)((long)pVVar9 + (ulong)bVar12 * -0x10 + 8);
      p_Var11 = p_Var11 + (ulong)bVar12 * -2 + 1;
    }
    bb_color(local_1668,local_1650);
    if (0 < (int)(uint)uVar10) {
      uVar5 = (ulong)((uint)uVar10 & 0x7fffffff);
      do {
        lVar6 = 0;
        lVar4 = 0;
        do {
          uVar10 = (pbVar8->P).super__Base_bitset<235UL>._M_w[lVar6];
          uVar10 = uVar10 - (uVar10 >> 1 & 0x5555555555555555);
          uVar10 = (uVar10 >> 2 & 0x3333333333333333) + (uVar10 & 0x3333333333333333);
          lVar4 = lVar4 + (((uVar10 >> 4) + uVar10 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38)
          ;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0xeb);
        if ((ulong)(lVar4 + *(int *)((long)local_1650 + uVar5 * 4 + -4)) <= (ulong)(long)LB) break;
        local_1648 = bb_stack.c.super__Deque_base<bb_content,_std::allocator<bb_content>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_cur;
        if (bb_stack.c.super__Deque_base<bb_content,_std::allocator<bb_content>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur ==
            bb_stack.c.super__Deque_base<bb_content,_std::allocator<bb_content>_>._M_impl.
            super__Deque_impl_data._M_finish._M_first) {
          local_1648 = bb_stack.c.super__Deque_base<bb_content,_std::allocator<bb_content>_>._M_impl
                       .super__Deque_impl_data._M_finish._M_node[-1] + 1;
        }
        pVVar9 = &local_1648[-1].nC;
        local_1670 = uVar5 - 1;
        local_1660 = (long)LB;
        local_1640 = uVar5;
        memcpy(pVVar9,local_1658,0x758);
        iVar1 = *(int *)((long)local_1668 + local_1670 * 4);
        uVar5 = (ulong)iVar1;
        if (14999 < uVar5) {
          std::__throw_out_of_range_fmt
                    ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",uVar5,15000
                    );
        }
        p_Var11 = (pbVar8->P).super__Base_bitset<235UL>._M_w + (uVar5 >> 6);
        *p_Var11 = *p_Var11 | 1L << ((byte)iVar1 & 0x3f);
        lVar4 = 0;
        do {
          p_Var11 = (pVVar9->super__Base_bitset<235UL>)._M_w + lVar4;
          *p_Var11 = *p_Var11 & N[uVar5].super__Base_bitset<235UL>._M_w[lVar4];
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0xeb);
        lVar4 = 0;
        uVar10 = 0;
        do {
          uVar7 = (pbVar8->P).super__Base_bitset<235UL>._M_w[lVar4];
          uVar7 = uVar7 - (uVar7 >> 1 & 0x5555555555555555);
          uVar7 = (uVar7 >> 2 & 0x3333333333333333) + (uVar7 & 0x3333333333333333);
          uVar10 = uVar10 + (((uVar7 >> 4) + uVar7 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38)
          ;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0xeb);
        bVar2 = local_1660 < uVar10;
        local_1660 = uVar5;
        if (bVar2) {
          bb_max_clq();
        }
        if ((pVVar9->super__Base_bitset<235UL>)._M_w[0] == 0) {
          uVar5 = 0xffffffffffffffff;
          do {
            if (uVar5 == 0xe9) {
              uVar10 = 0xea;
              break;
            }
            uVar10 = uVar5 + 1;
            lVar4 = uVar5 * 8;
            uVar5 = uVar10;
          } while (*(long *)((long)local_1648 + lVar4 + -0x748) == 0);
          if (uVar10 < 0xea) goto LAB_001161f3;
        }
        else {
LAB_001161f3:
          memcpy(&local_1638,pbVar8,0x758);
          memcpy(&local_1638.C,pVVar9,0x758);
          memset(&local_1638.nC,0,0x758);
          pbVar3 = bb_stack.c.super__Deque_base<bb_content,_std::allocator<bb_content>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_cur;
          if (bb_stack.c.super__Deque_base<bb_content,_std::allocator<bb_content>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur ==
              bb_stack.c.super__Deque_base<bb_content,_std::allocator<bb_content>_>._M_impl.
              super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<bb_content,_std::allocator<bb_content>_>::_M_push_back_aux<bb_content>
                      (&bb_stack.c,&local_1638);
          }
          else {
            memcpy(bb_stack.c.super__Deque_base<bb_content,_std::allocator<bb_content>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_cur,&local_1638,0x1608);
            bb_stack.c.super__Deque_base<bb_content,_std::allocator<bb_content>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur = pbVar3 + 1;
          }
          bb_max_clq();
        }
        uVar5 = local_1660;
        std::bitset<15000UL>::reset(&pbVar8->P,local_1660);
        std::bitset<15000UL>::reset(local_1658,uVar5);
        uVar5 = local_1670;
      } while (1 < (long)local_1640);
    }
    operator_delete__(local_1668);
    operator_delete__(local_1650);
  }
  std::deque<bb_content,_std::allocator<bb_content>_>::pop_back(&bb_stack.c);
  return;
}

Assistant:

void bb_max_clq() {
    if (controller -> TimeIsUp()) {
        bb_stack.pop();
        return;
    };
    Vset &P = bb_stack.top().P;
    Vset &C = bb_stack.top().C;

    ++TREE_SIZE;
    int sizeC = C.count();
    int *U = new int[sizeC];
    int *color = new int[sizeC];
    bb_color(C, U, color);
    for (int i = sizeC - 1; i >= 0; --i) {
        if (color[i] + P.count() <= LB) goto bb_finish;
        Vset &nC = bb_stack.top().nC;
        nC = C;
        int v = U[i];
        P.set(v); nC &= N[v];
        if (LB < P.count()) {
            LB = P.count();
            fprintf(stderr, "new LB: %d @ MAX CLIQUE\n", LB);
        }
        if (nC.any()) {
            bb_stack.push({P, nC, Vset()});
            bb_max_clq();
        }
        P.reset(v); C.reset(v);
    }

bb_finish:
    delete[] U;
    delete[] color;
    bb_stack.pop();
}